

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::AssignDescriptorsImpl(DescriptorTable *table)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  DescriptorPool *this;
  FileDescriptor *pFVar5;
  MessageFactory *factory_00;
  EnumDescriptor *descriptor;
  ServiceDescriptor *pSVar6;
  long in_RDI;
  int i_2;
  int i_1;
  int i;
  AssignDescriptorsHelper helper;
  MessageFactory *factory;
  FileDescriptor *file;
  LogMessage *in_stack_fffffffffffffec8;
  LogMessage *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffee0;
  Metadata *end;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int iVar7;
  WrappedMutex *name;
  int local_cc;
  int local_c8;
  int local_c4;
  MigrationSchema *in_stack_ffffffffffffff58;
  AssignDescriptorsHelper *in_stack_ffffffffffffff60;
  allocator local_31;
  string local_30 [32];
  FileDescriptor *local_10;
  long local_8;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  name = &AssignDescriptorsImpl::mu;
  local_8 = in_RDI;
  internal::WrappedMutex::Lock((WrappedMutex *)0x40a5c0);
  internal::AddDescriptors((DescriptorTable *)0x40a5cd);
  internal::WrappedMutex::Unlock((WrappedMutex *)0x40a5d7);
  this = DescriptorPool::internal_generated_pool();
  pcVar1 = *(char **)(local_8 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  pFVar5 = DescriptorPool::FindFileByName(this,(string *)name);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_10 = pFVar5;
  if (pFVar5 == (FileDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffee0,level,(char *)in_stack_fffffffffffffed0,
               (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    internal::LogMessage::operator<<(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    internal::LogMessage::~LogMessage((LogMessage *)0x40a6e7);
  }
  factory_00 = MessageFactory::generated_factory();
  AssignDescriptorsHelper::AssignDescriptorsHelper
            ((AssignDescriptorsHelper *)&stack0xffffffffffffff40,factory_00,
             *(Metadata **)(local_8 + 0x58),*(EnumDescriptor ***)(local_8 + 0x68),
             *(MigrationSchema **)(local_8 + 0x40),*(Message ***)(local_8 + 0x48),
             *(uint32 **)(local_8 + 0x50));
  local_c4 = 0;
  while (iVar7 = local_c4, iVar3 = FileDescriptor::message_type_count(local_10), iVar7 < iVar3) {
    FileDescriptor::message_type(local_10,local_c4);
    AssignDescriptorsHelper::AssignMessageDescriptor
              (in_stack_ffffffffffffff60,(Descriptor *)in_stack_ffffffffffffff58);
    local_c4 = local_c4 + 1;
  }
  local_c8 = 0;
  while (iVar3 = local_c8, iVar4 = FileDescriptor::enum_type_count(local_10), iVar3 < iVar4) {
    descriptor = FileDescriptor::enum_type(local_10,local_c8);
    AssignDescriptorsHelper::AssignEnumDescriptor
              ((AssignDescriptorsHelper *)&stack0xffffffffffffff40,descriptor);
    local_c8 = local_c8 + 1;
  }
  FileDescriptor::options(local_10);
  bVar2 = FileOptions::cc_generic_services((FileOptions *)0x40a87e);
  if (bVar2) {
    local_cc = 0;
    while (in_stack_fffffffffffffeec = local_cc, iVar4 = FileDescriptor::service_count(local_10),
          in_stack_fffffffffffffeec < iVar4) {
      pSVar6 = FileDescriptor::service(local_10,local_cc);
      *(ServiceDescriptor **)(*(long *)(local_8 + 0x70) + (long)local_cc * 8) = pSVar6;
      local_cc = local_cc + 1;
    }
  }
  MetadataOwner::Instance();
  end = *(Metadata **)(local_8 + 0x58);
  AssignDescriptorsHelper::GetCurrentMetadataPtr
            ((AssignDescriptorsHelper *)&stack0xffffffffffffff40);
  MetadataOwner::AddArray
            ((MetadataOwner *)CONCAT44(iVar7,iVar3),
             (Metadata *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),end);
  return;
}

Assistant:

void AssignDescriptorsImpl(const DescriptorTable* table) {
  // Ensure the file descriptor is added to the pool.
  {
    // This only happens once per proto file. So a global mutex to serialize
    // calls to AddDescriptors.
    static WrappedMutex mu{GOOGLE_PROTOBUF_LINKER_INITIALIZED};
    mu.Lock();
    AddDescriptors(table);
    mu.Unlock();
  }
  // Fill the arrays with pointers to descriptors and reflection classes.
  const FileDescriptor* file =
      DescriptorPool::internal_generated_pool()->FindFileByName(
          table->filename);
  GOOGLE_CHECK(file != nullptr);

  MessageFactory* factory = MessageFactory::generated_factory();

  AssignDescriptorsHelper helper(
      factory, table->file_level_metadata, table->file_level_enum_descriptors,
      table->schemas, table->default_instances, table->offsets);

  for (int i = 0; i < file->message_type_count(); i++) {
    helper.AssignMessageDescriptor(file->message_type(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    helper.AssignEnumDescriptor(file->enum_type(i));
  }
  if (file->options().cc_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      table->file_level_service_descriptors[i] = file->service(i);
    }
  }
  MetadataOwner::Instance()->AddArray(table->file_level_metadata,
                                      helper.GetCurrentMetadataPtr());
}